

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol.c
# Opt level: O2

t_symbol * stlook(int flag)

{
  int iVar1;
  uint hash;
  t_symbol *ptVar2;
  
  if ((symbol[1] == '@') || (symbol[1] == '.')) {
    if (glablptr == (t_symbol *)0x0) {
      error("Local symbol not allowed here!");
      return (t_symbol *)0x0;
    }
    ptVar2 = (t_symbol *)&glablptr->local;
    do {
      ptVar2 = ptVar2->next;
      if (ptVar2 == (t_symbol *)0x0) {
        if (flag == 0) {
          return (t_symbol *)0x0;
        }
        iVar1 = 1;
        hash = 0;
        goto LAB_0011210f;
      }
      iVar1 = strcmp(symbol,ptVar2->name);
    } while (iVar1 != 0);
  }
  else {
    hash = symhash();
    ptVar2 = (t_symbol *)(hash_tbl + hash);
    do {
      ptVar2 = ptVar2->next;
      if (ptVar2 == (t_symbol *)0x0) {
        if (flag == 0) {
          return (t_symbol *)0x0;
        }
        iVar1 = 0;
LAB_0011210f:
        ptVar2 = stinstall(hash,iVar1);
        return ptVar2;
      }
      iVar1 = strcmp(symbol,ptVar2->name);
    } while (iVar1 != 0);
  }
  ptVar2->refcnt = ptVar2->refcnt + 1;
  return ptVar2;
}

Assistant:

struct t_symbol *stlook(int flag)
{
	struct t_symbol *sym;
	int sym_flag = 0;
	int hash;

	/* local symbol */
	if (symbol[1] == '.' || symbol[1] == '@') {
		if (glablptr) {
			/* search the symbol in the local list */
			sym = glablptr->local;

			while (sym) {
				if (!strcmp(symbol, sym->name))
					break;
				sym = sym->next;
			}

			/* new symbol */
			if (sym == NULL) {
				if (flag) {
					sym = stinstall(0, 1);
					sym_flag = 1;
				}
			}
		}
		else {
			error("Local symbol not allowed here!");
			return (NULL);
		}
	}

	/* global symbol */
	else {
		/* search symbol */
		hash = symhash();
		sym  = hash_tbl[hash];
		while (sym) {
			if (!strcmp(symbol, sym->name))
				break;
			sym = sym->next;
		}

		/* new symbol */
		if (sym == NULL) {
			if (flag) {
				sym = stinstall(hash, 0);
				sym_flag = 1;
			}
		}
	}

	/* incremente symbol reference counter */
	if (sym_flag == 0) {
		if (sym)
			sym->refcnt++;
	}

	/* ok */
	return (sym);
}